

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

TTypeList * __thiscall
glslang::TParseContext::recordStructCopy
          (TParseContext *this,TStructRecord *record,TType *originType,TType *tmpType)

{
  byte bVar1;
  iterator iVar2;
  bool bVar3;
  int iVar4;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer ppVar8;
  pointer ppVar9;
  mapped_type *pmVar10;
  mapped_type *ppTVar11;
  map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  local_c8;
  _Self local_98;
  _Self local_90;
  iterator fixRecord;
  _Self local_80;
  iterator fixRecords;
  TTypeList *tmpStruct;
  TTypeList *originStruct;
  size_t tmpMemberHash;
  size_t originMemberHash;
  size_t i;
  size_t sStack_48;
  hash<unsigned_long> hasher;
  size_t tmpHash;
  size_t originHash;
  size_t memberCount;
  TType *tmpType_local;
  TType *originType_local;
  TStructRecord *record_local;
  TParseContext *this_local;
  
  pvVar5 = &TType::getStruct(tmpType)->
            super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size(pvVar5);
  tmpHash = 0;
  sStack_48 = 0;
  for (originMemberHash = 0; originMemberHash < sVar6; originMemberHash = originMemberHash + 1) {
    pvVar5 = &TType::getStruct(originType)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar5,originMemberHash);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    bVar1 = *(byte *)(CONCAT44(extraout_var,iVar4) + 0x10);
    pvVar5 = &TType::getStruct(originType)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar5,originMemberHash);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    tmpMemberHash =
         std::hash<unsigned_long>::operator()
                   ((hash<unsigned_long> *)((long)&i + 7),
                    (long)(int)((uint)(bVar1 & 0xf) +
                               (uint)((ulong)*(undefined8 *)(CONCAT44(extraout_var_00,iVar4) + 8) >>
                                     0x3d)));
    pvVar5 = &TType::getStruct(tmpType)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar5,originMemberHash);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    bVar1 = *(byte *)(CONCAT44(extraout_var_01,iVar4) + 0x10);
    pvVar5 = &TType::getStruct(tmpType)->
              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
    pvVar7 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::at
                       (pvVar5,originMemberHash);
    iVar4 = (*pvVar7->type->_vptr_TType[10])();
    originStruct = (TTypeList *)
                   std::hash<unsigned_long>::operator()
                             ((hash<unsigned_long> *)((long)&i + 7),
                              (long)(int)((uint)(bVar1 & 0xf) +
                                         (uint)((ulong)*(undefined8 *)
                                                        (CONCAT44(extraout_var_02,iVar4) + 8) >>
                                               0x3d)));
    tmpHash = std::hash<unsigned_long>::operator()
                        ((hash<unsigned_long> *)((long)&i + 7),(tmpHash ^ tmpMemberHash) << 1);
    sStack_48 = std::hash<unsigned_long>::operator()
                          ((hash<unsigned_long> *)((long)&i + 7),
                           (sStack_48 ^ (ulong)originStruct) << 1);
  }
  tmpStruct = TType::getStruct(originType);
  fixRecords._M_node = (_Base_ptr)TType::getStruct(tmpType);
  if (tmpHash == sStack_48) {
    this_local = (TParseContext *)tmpStruct;
  }
  else {
    local_80._M_node =
         (_Base_ptr)
         std::
         map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
         ::find(record,&tmpStruct);
    fixRecord._M_node =
         (_Base_ptr)
         std::
         map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
         ::end(record);
    bVar3 = std::operator!=(&local_80,(_Self *)&fixRecord);
    if (bVar3) {
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>
               ::operator->(&local_80);
      local_90._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
           ::find(&ppVar8->second,&stack0xffffffffffffffb8);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>
               ::operator->(&local_80);
      local_98._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
           ::end(&ppVar8->second);
      bVar3 = std::operator!=(&local_90,&local_98);
      iVar2 = fixRecords;
      if (bVar3) {
        ppVar9 = std::
                 _Rb_tree_iterator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>
                 ::operator->(&local_90);
        this_local = (TParseContext *)ppVar9->second;
      }
      else {
        pmVar10 = std::
                  map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                  ::operator[](record,&tmpStruct);
        ppTVar11 = std::
                   map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                   ::operator[](pmVar10,&stack0xffffffffffffffb8);
        *ppTVar11 = (mapped_type)iVar2._M_node;
        this_local = (TParseContext *)fixRecords._M_node;
      }
    }
    else {
      memset(&local_c8,0,0x30);
      std::
      map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
      ::map(&local_c8);
      pmVar10 = std::
                map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                ::operator[](record,&tmpStruct);
      std::
      map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
      ::operator=(pmVar10,&local_c8);
      std::
      map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
      ::~map(&local_c8);
      iVar2 = fixRecords;
      pmVar10 = std::
                map<const_glslang::TVector<glslang::TTypeLoc>_*,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>,_std::less<const_glslang::TVector<glslang::TTypeLoc>_*>,_std::allocator<std::pair<const_glslang::TVector<glslang::TTypeLoc>_*const,_std::map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>_>_>_>
                ::operator[](record,&tmpStruct);
      ppTVar11 = std::
                 map<unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                 ::operator[](pmVar10,&stack0xffffffffffffffb8);
      *ppTVar11 = (mapped_type)iVar2._M_node;
      this_local = (TParseContext *)fixRecords._M_node;
    }
  }
  return (TTypeList *)this_local;
}

Assistant:

const TTypeList* TParseContext::recordStructCopy(TStructRecord& record, const TType* originType, const TType* tmpType)
{
    size_t memberCount = tmpType->getStruct()->size();
    size_t originHash = 0, tmpHash = 0;
    std::hash<size_t> hasher;
    for (size_t i = 0; i < memberCount; i++) {
        size_t originMemberHash = hasher(originType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                         originType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        size_t tmpMemberHash = hasher(tmpType->getStruct()->at(i).type->getQualifier().layoutPacking +
                                      tmpType->getStruct()->at(i).type->getQualifier().layoutMatrix);
        originHash = hasher((originHash ^ originMemberHash) << 1);
        tmpHash = hasher((tmpHash ^ tmpMemberHash) << 1);
    }
    const TTypeList* originStruct = originType->getStruct();
    const TTypeList* tmpStruct = tmpType->getStruct();
    if (originHash != tmpHash) {
        auto fixRecords = record.find(originStruct);
        if (fixRecords != record.end()) {
            auto fixRecord = fixRecords->second.find(tmpHash);
            if (fixRecord != fixRecords->second.end()) {
                return fixRecord->second;
            } else {
                record[originStruct][tmpHash] = tmpStruct;
                return tmpStruct;
            }
        } else {
            record[originStruct] = std::map<size_t, const TTypeList*>();
            record[originStruct][tmpHash] = tmpStruct;
            return tmpStruct;
        }
    }
    return originStruct;
}